

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaB_type(lua_State *L)

{
  int iVar1;
  char *s;
  
  luaL_checkany(L,1);
  iVar1 = lua_type(L,1);
  if (iVar1 == -1) {
    s = "no value";
  }
  else {
    s = luaT_typenames[iVar1];
  }
  lua_pushstring(L,s);
  return 1;
}

Assistant:

static int luaB_type(lua_State*L){
luaL_checkany(L,1);
lua_pushstring(L,luaL_typename(L,1));
return 1;
}